

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

void DeduceShortFunctionReturnValue
               (ExpressionContext *ctx,SynBase *source,FunctionData *function,
               IntrusiveList<ExprBase> *expressions)

{
  TypeBase *pTVar1;
  TypeBase *returnType;
  bool bVar2;
  int iVar3;
  ExprBase *pEVar4;
  TypeFunction *pTVar5;
  undefined4 extraout_var;
  ExprBase *pEVar7;
  SynBase *pSVar8;
  ExprBase *pEVar9;
  ExprBase *pEVar6;
  
  if (function->hasExplicitReturn == false) {
    pTVar1 = function->type->returnType;
    if ((((pTVar1 != ctx->typeVoid) && (pEVar4 = expressions->tail, pEVar4 != (ExprBase *)0x0)) &&
        (returnType = pEVar4->type, returnType != ctx->typeVoid)) &&
       ((returnType == (TypeBase *)0x0 || (returnType->typeID != 0)))) {
      if (pTVar1 == ctx->typeAuto) {
        bVar2 = AssertValueExpression(ctx,pEVar4->source,pEVar4);
        if (!bVar2) {
          return;
        }
        pTVar5 = ExpressionContext::GetFunctionType(ctx,source,returnType,function->type->arguments)
        ;
        function->type = pTVar5;
      }
      else {
        pEVar4 = CreateCast(ctx,source,pEVar4,pTVar1,false);
      }
      iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
      pEVar6 = (ExprBase *)CONCAT44(extraout_var,iVar3);
      pTVar1 = ctx->typeVoid;
      pEVar7 = CreateFunctionCoroutineStateUpdate(ctx,source,function,0);
      pSVar8 = &ExpressionContext::MakeInternal(ctx,source)->super_SynBase;
      pSVar8 = (SynBase *)CreateFunctionUpvalueClose(ctx,pSVar8,function,ctx->scope);
      pEVar6->typeID = 0x1c;
      pEVar6->source = source;
      pEVar6->type = pTVar1;
      pEVar6->next = (ExprBase *)0x0;
      pEVar6->listed = false;
      pEVar6->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223b70;
      pEVar6[1]._vptr_ExprBase = (_func_int **)pEVar4;
      *(ExprBase **)&pEVar6[1].typeID = pEVar7;
      pEVar6[1].source = pSVar8;
      pEVar4 = expressions->tail;
      pEVar7 = expressions->head;
      if (expressions->head == pEVar4) {
        expressions->tail = pEVar6;
        expressions->head = pEVar6;
      }
      else {
        while (pEVar9 = pEVar7, pEVar9 != (ExprBase *)0x0) {
          pEVar7 = pEVar9->next;
          if (pEVar9->next == pEVar4) {
            pEVar9->next = pEVar6;
            pEVar7 = pEVar6;
          }
        }
      }
      function->hasExplicitReturn = true;
    }
  }
  return;
}

Assistant:

void DeduceShortFunctionReturnValue(ExpressionContext &ctx, SynBase *source, FunctionData *function, IntrusiveList<ExprBase> &expressions)
{
	if(function->hasExplicitReturn)
		return;

	TypeBase *expected = function->type->returnType;

	if(expected == ctx.typeVoid)
		return;

	TypeBase *actual = expressions.tail ? expressions.tail->type : ctx.typeVoid;

	if(actual == ctx.typeVoid)
		return;

	if(isType<TypeError>(actual))
		return;

	ExprBase *result = expressions.tail;

	// If return type is auto, set it to type that is being returned
	if(expected == ctx.typeAuto)
	{
		if(result && !AssertValueExpression(ctx, result->source, result))
			return;

		function->type = ctx.GetFunctionType(source, actual, function->type->arguments);
	}
	else
	{
		result = CreateCast(ctx, source, expressions.tail, expected, false);
	}

	result = new (ctx.get<ExprReturn>()) ExprReturn(source, ctx.typeVoid, result, CreateFunctionCoroutineStateUpdate(ctx, source, function, 0), CreateFunctionUpvalueClose(ctx, ctx.MakeInternal(source), function, ctx.scope));

	if(expressions.head == expressions.tail)
	{
		expressions.head = expressions.tail = result;
	}
	else
	{
		ExprBase *curr = expressions.head;

		while(curr)
		{
			if(curr->next == expressions.tail)
				curr->next = result;

			curr = curr->next;
		}
	}

	function->hasExplicitReturn = true;
}